

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O3

Metric * __thiscall Metrics::NewMetric(Metrics *this,string *name)

{
  iterator __position;
  Metric *pMVar1;
  Metric *metric;
  Metric *local_28;
  
  pMVar1 = (Metric *)operator_new(0x30);
  (pMVar1->name)._M_dataplus._M_p = (pointer)&(pMVar1->name).field_2;
  (pMVar1->name)._M_string_length = 0;
  (pMVar1->name).field_2._M_local_buf[0] = '\0';
  local_28 = pMVar1;
  std::__cxx11::string::_M_assign((string *)pMVar1);
  pMVar1->count = 0;
  pMVar1->sum = 0;
  __position._M_current = *(Metric ***)&this->field_0x8;
  if (__position._M_current == *(Metric ***)&this->field_0x10) {
    std::vector<Metric*,std::allocator<Metric*>>::_M_realloc_insert<Metric*const&>
              ((vector<Metric*,std::allocator<Metric*>> *)this,__position,&local_28);
  }
  else {
    *__position._M_current = pMVar1;
    *(long *)&this->field_0x8 = *(long *)&this->field_0x8 + 8;
    local_28 = pMVar1;
  }
  return local_28;
}

Assistant:

Metric* Metrics::NewMetric(const string& name) {
  Metric* metric = new Metric;
  metric->name = name;
  metric->count = 0;
  metric->sum = 0;
  metrics_.push_back(metric);
  return metric;
}